

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSource.hpp
# Opt level: O3

void __thiscall
Outputs::Speaker::SampleSource<GI::AY38910::AY38910<false>,_false,_4>::
apply_samples<(Outputs::Speaker::Action)1>
          (SampleSource<GI::AY38910::AY38910<false>,_false,_4> *this,size_t number_of_samples,
          type *target)

{
  AY38910SampleSource<false> *this_00;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  type tVar4;
  undefined6 extraout_var;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  
  this_00 = (AY38910SampleSource<false> *)(this + -0x454);
  tVar4 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
  iVar2 = this->master_divider_;
  if (iVar2 == 4 || number_of_samples == 0) {
    uVar9 = 0;
  }
  else {
    uVar5 = 0;
    do {
      target[uVar5] = target[uVar5] + tVar4;
      uVar9 = uVar5 + 1;
      if (number_of_samples <= uVar9) break;
      iVar3 = (int)uVar5;
      uVar5 = uVar9;
    } while (iVar2 + iVar3 != 3);
    this->master_divider_ = iVar2 + (int)uVar9;
  }
  GI::AY38910::AY38910SampleSource<false>::advance(this_00);
  uVar8 = number_of_samples - uVar9;
  uVar7 = uVar8 >> 2;
  uVar5 = uVar9;
  if ((int)uVar7 != 0) {
    do {
      uVar9 = uVar5 + 4;
      tVar4 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
      auVar11 = ZEXT416((uint)CONCAT62(extraout_var,tVar4));
      auVar11 = pshuflw(auVar11,auVar11,0);
      uVar1 = *(undefined8 *)(target + uVar5);
      *(ulong *)(target + uVar5) =
           CONCAT26((short)((ulong)uVar1 >> 0x30) + auVar11._6_2_,
                    CONCAT24((short)((ulong)uVar1 >> 0x20) + auVar11._4_2_,
                             CONCAT22((short)((ulong)uVar1 >> 0x10) + auVar11._2_2_,
                                      (short)uVar1 + auVar11._0_2_)));
      GI::AY38910::AY38910SampleSource<false>::advance(this_00);
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
      uVar5 = uVar9;
    } while (uVar6 != 0);
    uVar8 = number_of_samples - uVar9;
  }
  GI::AY38910::AY38910SampleSource<false>::level(this_00);
  this->master_divider_ = (int)uVar8;
  tVar4 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
  if (uVar9 != number_of_samples) {
    lVar10 = uVar9 * 2;
    do {
      *(short *)((long)target + lVar10) = *(short *)((long)target + lVar10) + tVar4;
      lVar10 = lVar10 + 2;
    } while (number_of_samples * 2 != lVar10);
  }
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, typename SampleT<stereo>::type *target) {
			auto &source = *static_cast<SourceT *>(this);

			if constexpr (divider == 1) {
				while(number_of_samples--) {
					apply<action>(*target, source.level());
					++target;
					source.advance();
				}
			} else {
				std::size_t c = 0;

				// Fill in the tail of any partially-captured level.
				auto level = source.level();
				while(c < number_of_samples && master_divider_ != divider) {
					apply<action>(target[c], level);
					++c;
					++master_divider_;
				}
				source.advance();

				// Provide all full levels.
				auto whole_steps = static_cast<int>((number_of_samples - c) / divider);
				while(whole_steps--) {
					fill<action>(&target[c], &target[c + divider], source.level());
					c += divider;
					source.advance();
				}

				// Provide the head of a further partial capture.
				level = source.level();
				master_divider_ = static_cast<int>(number_of_samples - c);
				fill<action>(&target[c], &target[number_of_samples], source.level());
			}
		}